

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

bool __thiscall Controller::removeGraphic(Controller *this)

{
  BoardMode BVar1;
  pointer pBVar2;
  Controller *this_local;
  
  std::unique_ptr<ImageProvider,_std::default_delete<ImageProvider>_>::reset
            (&this->imageProvider,(pointer)0x0);
  pBVar2 = std::unique_ptr<Board,_std::default_delete<Board>_>::operator->(&this->board);
  BVar1 = Board::getMode(pBVar2);
  if (BVar1 == GRAPHIC) {
    pBVar2 = std::unique_ptr<Board,_std::default_delete<Board>_>::operator->(&this->board);
    Board::setMode(pBVar2,NUMERIC);
  }
  return BVar1 == GRAPHIC;
}

Assistant:

bool Controller::removeGraphic()
{
    imageProvider.reset();

    if ( board->getMode() == BoardMode::GRAPHIC )
    {
        board->setMode( BoardMode::NUMERIC );
        return true;
    }
    return false;
}